

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O0

string * __thiscall MinVR::VRDataIndex::addData(VRDataIndex *this,string *keyAndValue)

{
  bool bVar1;
  allocator<char> *__a;
  char *in_RDX;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000038;
  int *in_stack_00000040;
  string *in_stack_00000048;
  string *in_stack_00000050;
  string *in_stack_00000058;
  VRError *in_stack_00000060;
  VRCORETYPE_ID type;
  string value;
  string key;
  size_t poseql;
  allocator<char> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  string *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  VRDataIndex *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  VRDataIndex *in_stack_fffffffffffffeb0;
  allocator<char> local_131;
  string local_130 [36];
  VRCORETYPE_ID local_10c;
  string local_108 [32];
  string local_e8 [38];
  undefined1 local_c2;
  undefined4 local_a0;
  long local_20;
  char *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  local_20 = std::__cxx11::string::find(in_RDX,0x194588);
  if (local_20 == -1) {
    local_c2 = 1;
    __a = (allocator<char> *)__cxa_allocate_exception(0xa8);
    std::operator+(in_RSI,this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)in_RDI,__a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)in_RDI,__a);
    local_a0 = 0x498;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)in_RDI,__a);
    VRError::VRError(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,
                     in_stack_00000040,in_stack_00000038);
    local_c2 = 0;
    __cxa_throw(__a,&VRError::typeinfo,VRError::~VRError);
  }
  std::__cxx11::string::substr((ulong)local_e8,(ulong)local_18);
  std::__cxx11::string::substr((ulong)local_108,(ulong)local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_RDI,in_stack_fffffffffffffe60);
  bVar1 = exists(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (string *)in_stack_fffffffffffffea0,(bool)in_stack_fffffffffffffe9f);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_RDI,in_stack_fffffffffffffe60);
    local_10c = getType(in_stack_fffffffffffffea0,
                        (string *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                        in_stack_fffffffffffffe90,(bool)in_stack_fffffffffffffe8f);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffea7);
  }
  else {
    local_10c = _inferType((VRDataIndex *)
                           CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                           in_stack_fffffffffffffe80);
  }
  std::__cxx11::string::string((string *)&stack0xfffffffffffffe80,local_108);
  _processValue((VRDataIndex *)key.field_2._8_8_,(string *)key.field_2._M_allocated_capacity,
                (VRCORETYPE_ID *)key._M_string_length,(string *)key._0_8_,
                value.field_2._M_local_buf[0xf]);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe80);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_e8);
  return this_00;
}

Assistant:

std::string VRDataIndex::addData(const std::string &keyAndValue) {

  size_t poseql = keyAndValue.find("=");
  if (poseql == std::string::npos) {
    VRERRORNOADV("MinVR Error: Expected a key=value format for the string: " +
                 keyAndValue);
  }
  std::string key = keyAndValue.substr(0,poseql);
  std::string value = keyAndValue.substr(poseql+1);

  //  std::cout << "MinVR: Setting config value: " << key << "=" << value << std::endl;

  // If the key already exists, then match the existing type, otherwise infer
  // the type as usual.
  VRCORETYPE_ID type;
  if (exists(key, "/")) {
    type = getType(key);

  } else {

    type = _inferType(value);
  }

  // Got the name, type, value.  Go ahead and insert it into the index.
  return _processValue(key, type, value, MINVRSEPARATOR);
}